

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::MRTCaseGroup::MRTCase::iterate(MRTCase *this)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  glUniform4fFunc p_Var2;
  bool bVar3;
  int iVar4;
  GLenum GVar5;
  GLint GVar6;
  GLuint GVar7;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  TestError *this_00;
  byte bVar10;
  undefined1 *puVar11;
  GLSLVersion glslVersion;
  char *description;
  allocator<char> local_362;
  allocator<char> local_361;
  TestLog *local_360;
  undefined4 local_354;
  MRTCase *local_350;
  GLubyte result [4];
  GLuint vbo;
  GLuint vao;
  undefined4 uStack_304;
  FBOSentry fbo;
  string frgSrc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram p;
  undefined1 local_1b0 [384];
  Functions *pFVar8;
  
  local_360 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar8 = (Functions *)CONCAT44(extraout_var,iVar4);
  bVar3 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (!bVar3) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
    return STOP;
  }
  if ((iterate()::frgSrcTemplate == '\0') &&
     (iVar4 = __cxa_guard_acquire(&iterate()::frgSrcTemplate), iVar4 != 0)) {
    iterate::frgSrcTemplate =
         "${VERSION_DIRECTIVE}\n#extension GL_KHR_blend_equation_advanced : require\n\nprecision highp float;\nlayout (blend_support_multiply) out;\nlayout (location = 0) out vec4 oCol0;\nlayout (location = 1) out vec4 oCol1;\n\nuniform vec4 uMultCol;\n\nvoid main (void) {\n   oCol0 = uMultCol;\n   oCol1 = uMultCol;\n}\n"
    ;
    if (this->m_declarationType == ARRAY) {
      iterate::frgSrcTemplate =
           "${VERSION_DIRECTIVE}\n#extension GL_KHR_blend_equation_advanced : require\n\nprecision highp float;\nlayout (blend_support_multiply) out;\nlayout (location = 0) out vec4 oCol[2];\n\nuniform vec4 uMultCol;\n\nvoid main (void) {\n   oCol[0] = uMultCol;\n   oCol[1] = uMultCol;\n}\n"
      ;
    }
    __cxa_guard_release(&iterate()::frgSrcTemplate);
  }
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"VERSION_DIRECTIVE",(allocator<char> *)&p);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)local_1b0);
  std::__cxx11::string::assign((char *)pmVar9);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,iterate::frgSrcTemplate,(allocator<char> *)&vbo);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_1b0,(string *)&p);
  tcu::StringTemplate::specialize(&frgSrc,(StringTemplate *)local_1b0,&args);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_1b0);
  std::__cxx11::string::~string((string *)&p);
  fbo.m_gl = pFVar8;
  FBOSentry::init(&fbo,(EVP_PKEY_CTX *)&DAT_00000004);
  (*pFVar8->drawBuffers)(2,iterate::bufs);
  (*pFVar8->clearColor)(1.0,1.0,1.0,1.0);
  (*pFVar8->clear)(0x4000);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  GetDef2DVtxSrc_abi_cxx11_((string *)&vao,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vbo,(char *)CONCAT44(uStack_304,vao),&local_361);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)result,frgSrc._M_dataplus._M_p,&local_362);
  glu::makeVtxFragSources((ProgramSources *)local_1b0,(string *)&vbo,(string *)result);
  glu::ShaderProgram::ShaderProgram(&p,renderCtx,(ProgramSources *)local_1b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
  std::__cxx11::string::~string((string *)result);
  std::__cxx11::string::~string((string *)&vbo);
  std::__cxx11::string::~string((string *)&vao);
  if (p.m_program.m_info.linkOk == false) {
    glu::operator<<(local_360,&p);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
               ,0x5cc);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar8->useProgram)(p.m_program.m_program);
  GVar5 = (*pFVar8->getError)();
  glu::checkError(GVar5,"Program failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5d0);
  (*pFVar8->disable)(0xbd0);
  (*pFVar8->enable)(0xbe2);
  (*pFVar8->blendEquation)(0x9297);
  GVar5 = (*pFVar8->getError)();
  glu::checkError(GVar5,"BlendEquation failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5d6);
  p_Var2 = pFVar8->uniform4f;
  GVar6 = (*pFVar8->getUniformLocation)(p.m_program.m_program,"uMultCol");
  (*p_Var2)(GVar6,0.0,0.0,0.0,1.0);
  GVar5 = (*pFVar8->getError)();
  glu::checkError(GVar5,"Uniforms failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5da);
  (*pFVar8->genBuffers)(1,&vbo);
  (*pFVar8->bindBuffer)(0x8892,vbo);
  (*pFVar8->bufferData)(0x8892,0x20,s_pos,0x88e4);
  (*pFVar8->genVertexArrays)(1,&vao);
  (*pFVar8->bindVertexArray)(vao);
  GVar7 = (*pFVar8->getAttribLocation)(p.m_program.m_program,"aPos");
  (*pFVar8->enableVertexAttribArray)(GVar7);
  (*pFVar8->vertexAttribPointer)(GVar7,2,0x1406,'\0',8,(void *)0x0);
  GVar5 = (*pFVar8->getError)();
  glu::checkError(GVar5,"Attributes failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5e9);
  (*pFVar8->drawArrays)(5,0,4);
  GVar5 = (*pFVar8->getError)();
  puVar11 = s_indices;
  (*pFVar8->drawElements)(4,6,0x1403,s_indices);
  if (GVar5 == 0x502) {
    GVar5 = (*pFVar8->getError)();
    local_354 = (undefined4)CONCAT71((int7)((ulong)puVar11 >> 8),1);
    if (GVar5 == 0x502) goto LAB_00d4d2f4;
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_360;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"DrawArrays/DrawElements didn\'t produce error.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_354 = 0;
LAB_00d4d2f4:
  bVar10 = 1;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_350 = this;
  for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
    builtin_memcpy(result,"\x01\x02\x03\x04",4);
    (*pFVar8->readBuffer)(0x8ce0);
    (*pFVar8->readPixels)(0,0,1,1,0x1908,0x1401,result);
    GVar5 = (*pFVar8->getError)();
    glu::checkError(GVar5,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x5fb);
    if (result != (GLubyte  [4])0xffffffff) {
      local_1b0._0_8_ = local_360;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Buffer ");
      std::ostream::operator<<(poVar1,iVar4);
      std::operator<<((ostream *)poVar1," ");
      std::operator<<((ostream *)poVar1,"contents changed: ");
      tcu::operator<<((ostream *)poVar1,(RGBA)result);
      std::operator<<((ostream *)poVar1," expected:");
      tcu::operator<<((ostream *)poVar1,(RGBA)0xffffffff);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar10 = 0;
    }
  }
  (*pFVar8->deleteVertexArrays)(1,&vao);
  (*pFVar8->deleteBuffers)(1,&vbo);
  bVar10 = (byte)local_354 & bVar10;
  description = "Fail";
  if (bVar10 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_350->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar10 ^ 1),
             description);
  glu::ShaderProgram::~ShaderProgram(&p);
  FBOSentry::~FBOSentry(&fbo);
  std::__cxx11::string::~string((string *)&frgSrc);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  return STOP;
}

Assistant:

MRTCaseGroup::MRTCase::IterateResult MRTCaseGroup::MRTCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	static const char* frgSrcTemplateArray = "${VERSION_DIRECTIVE}\n"
											 "#extension GL_KHR_blend_equation_advanced : require\n"
											 "\n"
											 "precision highp float;\n"
											 "layout (blend_support_multiply) out;\n"
											 "layout (location = 0) out vec4 oCol[2];\n"
											 "\n"
											 "uniform vec4 uMultCol;\n"
											 "\n"
											 "void main (void) {\n"
											 "   oCol[0] = uMultCol;\n"
											 "   oCol[1] = uMultCol;\n"
											 "}\n";

	static const char* frgSrcTemplateSeparate = "${VERSION_DIRECTIVE}\n"
												"#extension GL_KHR_blend_equation_advanced : require\n"
												"\n"
												"precision highp float;\n"
												"layout (blend_support_multiply) out;\n"
												"layout (location = 0) out vec4 oCol0;\n"
												"layout (location = 1) out vec4 oCol1;\n"
												"\n"
												"uniform vec4 uMultCol;\n"
												"\n"
												"void main (void) {\n"
												"   oCol0 = uMultCol;\n"
												"   oCol1 = uMultCol;\n"
												"}\n";

	static const char* frgSrcTemplate = m_declarationType == ARRAY ? frgSrcTemplateArray : frgSrcTemplateSeparate;

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	std::string frgSrc		  = tcu::StringTemplate(frgSrcTemplate).specialize(args);

	FBOSentry fbo(gl, 4, 4, GL_RGBA8, GL_RGBA8);

	static const glw::GLenum bufs[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
	gl.drawBuffers(2, bufs);

	// Clear buffers to white.
	gl.clearColor(1.f, 1.f, 1.f, 1.f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Setup program.
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}

	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);
	gl.blendEquation(GL_DARKEN_KHR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	// Multiply with zero.
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uMultCol"), 0.f, 0.f, 0.f, 1.00f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

	// Set vertex buffer
	glw::GLuint vbo;
	gl.genBuffers(1, &vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_pos), s_pos, GL_STATIC_DRAW);

	// Set vertices.
	glw::GLuint vao;
	gl.genVertexArrays(1, &vao);
	gl.bindVertexArray(vao);
	glw::GLint loc = gl.getAttribLocation(p.getProgram(), "aPos");
	gl.enableVertexAttribArray(loc);
	gl.vertexAttribPointer(loc, 2, GL_FLOAT, GL_FALSE, 8, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	bool errorOk = (gl.getError() == GL_INVALID_OPERATION);

	gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, s_indices);
	errorOk = errorOk && (gl.getError() == GL_INVALID_OPERATION);

	if (!errorOk)
		log << TestLog::Message << "DrawArrays/DrawElements didn't produce error." << TestLog::EndMessage;

	// Expect unaltered destination pixels.
	bool contentsOk = true;
	for (int i = 0; i < 2; i++)
	{
		glw::GLubyte result[4] = { 1, 2, 3, 4 };
		gl.readBuffer(bufs[0]);
		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, result);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
		if (tcu::RGBA::fromBytes(result) != tcu::RGBA::white())
		{
			contentsOk = false;
			log << TestLog::Message << "Buffer " << i << " "
				<< "contents changed: " << tcu::RGBA::fromBytes(result) << " expected:" << tcu::RGBA::white()
				<< TestLog::EndMessage;
		}
	}

	gl.deleteVertexArrays(1, &vao);
	gl.deleteBuffers(1, &vbo);

	bool pass = errorOk && contentsOk;
	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");
	return STOP;
}